

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::changeCostsInterface(Highs *this,HighsIndexCollection *index_collection,double *cost)

{
  HighsLogOptions *log_options;
  HighsInt cost_scale;
  bool bVar1;
  HighsInt iCol;
  uint uVar2;
  HighsStatus HVar3;
  HighsStatus HVar4;
  ulong uVar5;
  double dVar6;
  bool local_has_infinite_cost;
  allocator local_e9;
  vector<double,_std::allocator<double>_> local_colCost;
  string local_d0;
  string local_b0;
  HighsLogOptions local_90;
  
  uVar2 = dataSize(index_collection);
  if ((int)uVar2 < 1) {
    return kOk;
  }
  std::__cxx11::string::string((string *)&local_b0,"column costs",(allocator *)&local_d0);
  log_options = &(this->options_).super_HighsOptionsStruct.log_options;
  bVar1 = doubleUserDataNotNull(log_options,cost,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if (bVar1) {
    return kError;
  }
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,std::allocator<double>> *)&local_colCost,cost,cost + uVar2,
             (allocator_type *)&local_d0);
  local_has_infinite_cost = false;
  HighsLogOptions::HighsLogOptions(&local_90,log_options);
  HVar3 = assessCosts(&this->options_,0,index_collection,&local_colCost,&local_has_infinite_cost,
                      (this->options_).super_HighsOptionsStruct.infinite_cost);
  std::__cxx11::string::string((string *)&local_d0,"assessCosts",&local_e9);
  HVar4 = interpretCallStatus(&local_90,HVar3,kOk,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
  HVar3 = kError;
  if (HVar4 != kError) {
    cost_scale = (this->model_).lp_.user_cost_scale_;
    if (cost_scale != 0) {
      bVar1 = costScaleOk(&local_colCost,cost_scale,
                          (this->options_).super_HighsOptionsStruct.infinite_cost);
      if (!bVar1) {
        highsLogUser(log_options,kError,"User cost scaling yields infinite cost\n");
        goto LAB_00251274;
      }
      dVar6 = ldexp(1.0,(this->model_).lp_.user_cost_scale_);
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        local_colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar5] =
             local_colCost.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5] * dVar6;
      }
    }
    changeLpCosts(&(this->model_).lp_,index_collection,&local_colCost,
                  (this->options_).super_HighsOptionsStruct.infinite_cost);
    bVar1 = true;
    if ((this->model_).lp_.has_infinite_cost_ == false) {
      bVar1 = local_has_infinite_cost;
    }
    (this->model_).lp_.has_infinite_cost_ = bVar1;
    invalidateModelStatusSolutionAndInfo(this);
    HVar3 = kOk;
    HEkk::updateStatus(&this->ekk_instance_,kNewCosts);
  }
LAB_00251274:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&local_colCost.super__Vector_base<double,_std::allocator<double>_>);
  return HVar3;
}

Assistant:

HighsStatus Highs::changeCostsInterface(HighsIndexCollection& index_collection,
                                        const double* cost) {
  HighsInt num_cost = dataSize(index_collection);
  // If a non-positive number of costs (may) need changing nothing needs to be
  // done
  if (num_cost <= 0) return HighsStatus::kOk;
  if (doubleUserDataNotNull(options_.log_options, cost, "column costs"))
    return HighsStatus::kError;
  // Take a copy of the cost that can be normalised
  std::vector<double> local_colCost{cost, cost + num_cost};
  HighsStatus return_status = HighsStatus::kOk;
  bool local_has_infinite_cost = false;
  return_status = interpretCallStatus(
      options_.log_options,
      assessCosts(options_, 0, index_collection, local_colCost,
                  local_has_infinite_cost, options_.infinite_cost),
      return_status, "assessCosts");
  if (return_status == HighsStatus::kError) return return_status;
  HighsLp& lp = model_.lp_;
  if (lp.user_cost_scale_) {
    // Assess and apply any user cost scaling
    if (!costScaleOk(local_colCost, lp.user_cost_scale_,
                     options_.infinite_cost)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User cost scaling yields infinite cost\n");
      return HighsStatus::kError;
    }
    double cost_scale_value = std::pow(2, lp.user_cost_scale_);
    for (HighsInt iCol = 0; iCol < num_cost; iCol++)
      local_colCost[iCol] *= cost_scale_value;
  }
  changeLpCosts(lp, index_collection, local_colCost, options_.infinite_cost);

  // Interpret possible introduction of infinite costs
  lp.has_infinite_cost_ = lp.has_infinite_cost_ || local_has_infinite_cost;
  assert(lp.has_infinite_cost_ == lp.hasInfiniteCost(options_.infinite_cost));

  // Deduce the consequences of new costs
  invalidateModelStatusSolutionAndInfo();
  // Determine any implications for simplex data
  ekk_instance_.updateStatus(LpAction::kNewCosts);
  return HighsStatus::kOk;
}